

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::find_position<std::pair<int,int>>
          (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,pair<int,_int> *key)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  
  lVar3 = *(long *)(this + 0x60);
  uVar6 = (ulong)key->first;
  *(int *)(this + 4) = *(int *)(this + 4) + 1;
  uVar7 = 0xffffffffffffffff;
  lVar8 = 1;
  do {
    uVar6 = uVar6 & lVar3 - 1U;
    iVar1 = *(int *)(*(long *)(this + 0x78) + uVar6 * 8);
    *(int *)(this + 0x38) = *(int *)(this + 0x38) + 1;
    if (iVar1 + *(int *)(this + 0x44) == 0) {
      uVar5 = uVar6;
      if (uVar7 != 0xffffffffffffffff) {
        uVar5 = uVar7;
      }
      uVar6 = 0xffffffffffffffff;
LAB_006fb043:
      pVar9.second = uVar5;
      pVar9.first = uVar6;
      return pVar9;
    }
    bVar4 = dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::test_deleted((dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this,uVar6);
    if (bVar4) {
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar6;
      }
    }
    else {
      iVar1 = key->first;
      iVar2 = *(int *)(*(long *)(this + 0x78) + uVar6 * 8);
      *(int *)(this + 0x38) = *(int *)(this + 0x38) + 1;
      if (iVar2 + iVar1 == 0) {
        uVar5 = 0xffffffffffffffff;
        goto LAB_006fb043;
      }
    }
    uVar6 = uVar6 + lVar8;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    while (1) {                             // probe until something happens
      if (test_empty(bucknum)) {            // bucket is empty
        if (insert_pos == ILLEGAL_BUCKET)   // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);

      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;

      } else if (equals(key, get_key(table[bucknum]))) {
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }